

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

int __thiscall CVmPackPos::parse_int(CVmPackPos *this)

{
  uint uVar1;
  wchar_t c_00;
  int iVar2;
  CVmPackPos *in_RDI;
  wchar_t c;
  int acc;
  int start_idx;
  int local_10;
  
  uVar1 = in_RDI->idx;
  local_10 = 0;
  while( true ) {
    c_00 = getch(in_RDI);
    iVar2 = is_digit(L'\0');
    if (iVar2 == 0) {
      return local_10;
    }
    iVar2 = value_of_digit(c_00);
    local_10 = iVar2 + local_10 * 10;
    if (local_10 < 0) break;
    inc(in_RDI);
  }
  err_throw_a(0x6b,1,0,(ulong)uVar1);
}

Assistant:

int parse_int()
    {
        /* remember the starting location, for error reporting */
        int start_idx = idx;

        /* parse digits until we find something else */
        int acc;
        wchar_t c;
        for (acc = 0 ; is_digit(c = getch()) ; inc())
        {
            /* add the digit into the accumulator */
            acc *= 10;
            acc += value_of_digit(c);

            /* if this overflows an int, it's an error */
            if (acc < 0)
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, start_idx);
        }

        /* return the result */
        return acc;
    }